

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_Error cff_get_var_blend(CFF_Face face,FT_UInt *num_coords,FT_Fixed **coords,
                          FT_Fixed **normalizedcoords,FT_MM_Var **mm_var)

{
  FT_Error FVar1;
  FT_Service_MultiMasters mm;
  FT_MM_Var **mm_var_local;
  FT_Fixed **normalizedcoords_local;
  FT_Fixed **coords_local;
  FT_UInt *num_coords_local;
  CFF_Face face_local;
  
  FVar1 = (**(code **)((long)face->mm + 0x78))(face,num_coords,coords,normalizedcoords,mm_var);
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_get_var_blend( CFF_Face     face,
                     FT_UInt     *num_coords,
                     FT_Fixed*   *coords,
                     FT_Fixed*   *normalizedcoords,
                     FT_MM_Var*  *mm_var )
  {
    FT_Service_MultiMasters  mm = (FT_Service_MultiMasters)face->mm;


    return mm->get_var_blend( FT_FACE( face ),
                              num_coords,
                              coords,
                              normalizedcoords,
                              mm_var );
  }